

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

void testing::internal::ReportInvalidTestCaseType(char *test_case_name,char *file,int line)

{
  ostream *poVar1;
  FILE *__stream;
  _Alloc_hider _Var2;
  int in_ECX;
  size_t sVar3;
  char *pcVar4;
  string local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  string local_48;
  
  Message::Message((Message *)&local_50);
  poVar1 = (ostream *)(local_50.ptr_ + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"Attempted redefinition of test case ",0x24);
  if (test_case_name == (char *)0x0) {
    sVar3 = 6;
    pcVar4 = "(null)";
  }
  else {
    sVar3 = strlen(test_case_name);
    pcVar4 = test_case_name;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar4,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"All tests in the same test case must use the same test fixture\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"class.  However, in test case ",0x1e);
  if (test_case_name == (char *)0x0) {
    sVar3 = 6;
    test_case_name = "(null)";
  }
  else {
    sVar3 = strlen(test_case_name);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,test_case_name,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", you tried\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"to define a test using a fixture class different from the one\n",0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"used earlier. This can happen if the two fixture classes are\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"from different namespaces and have the same name. You should\n",0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"probably rename one of the classes to put the tests into different\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"test cases.",0xb);
  __stream = _stderr;
  FormatFileLocation_abi_cxx11_(&local_70,(internal *)file,(char *)(ulong)(uint)line,in_ECX);
  _Var2._M_p = local_70._M_dataplus._M_p;
  StringStreamToString(&local_48,local_50.ptr_);
  fprintf(__stream,"%s %s",_Var2._M_p,local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_50.ptr_ + 8))(local_50.ptr_);
  }
  return;
}

Assistant:

void ReportInvalidTestCaseType(const char* test_case_name,
                               const char* file, int line) {
  Message errors;
  errors
      << "Attempted redefinition of test case " << test_case_name << ".\n"
      << "All tests in the same test case must use the same test fixture\n"
      << "class.  However, in test case " << test_case_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test cases.";

  fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
          errors.GetString().c_str());
}